

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>
               (ArgMinMaxState<short,_duckdb::string_t> *state,short x_data,string_t y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<short,_duckdb::string_t> *in_RDX;
  undefined2 in_SI;
  short *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  string_t *in_stack_ffffffffffffffc8;
  string_t *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffe0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_stack_ffffffffffffffd0);
  if ((bVar1) &&
     (bVar1 = GreaterThan::Operation<duckdb::string_t>
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_RDI);
    Assign<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>
              (in_RDX,in_RDI,(string_t *)CONCAT26(in_SI,in_stack_ffffffffffffffe0),
               SUB81((ulong)in_R8 >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}